

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O3

void simgui_setup(simgui_desc_t *desc)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  sg_buffer sVar8;
  sg_image sVar9;
  sg_shader sVar10;
  sg_pipeline sVar11;
  void *pvVar12;
  ImGuiIO *pIVar13;
  int font_height;
  int font_width;
  sg_buffer_desc ib_desc;
  sg_buffer_desc vb_desc;
  sg_pipeline_desc pip_desc;
  int local_f20;
  int local_f1c;
  sg_buffer_desc local_f18;
  sg_buffer_desc local_eb8;
  sg_pipeline_desc local_e50;
  sg_shader_desc local_c18;
  
  if (desc == (simgui_desc_t *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x6cb,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui.indices = (sg_range)ZEXT816(0);
  _simgui.vertices = (sg_range)ZEXT816(0);
  _simgui.ibuf.id = 0;
  _simgui.img.id = 0;
  _simgui.shd.id = 0;
  _simgui.pip.id = 0;
  _simgui.desc.allocator.user_data._0_4_ = 0;
  _simgui.desc.allocator.user_data._4_4_ = 0;
  _simgui.cur_dpi_scale = 0.0;
  _simgui.vbuf.id = 0;
  _simgui.desc.allocator.alloc._0_4_ = 0;
  _simgui.desc.allocator.alloc._4_4_ = 0;
  _simgui.desc.allocator.free._0_4_ = 0;
  _simgui.desc.allocator.free._4_4_ = 0;
  _simgui.desc.ini_filename._0_4_ = 0;
  _simgui.desc.ini_filename._4_4_ = 0;
  _simgui.desc.no_default_font = false;
  _simgui.desc.disable_paste_override = false;
  _simgui.desc.disable_set_mouse_cursor = false;
  _simgui.desc.disable_windows_resize_from_edges = false;
  _simgui.desc.write_alpha_channel = false;
  _simgui.desc._29_3_ = 0;
  _simgui.desc.max_vertices = 0;
  _simgui.desc.color_format = _SG_PIXELFORMAT_DEFAULT;
  _simgui.desc.depth_format = _SG_PIXELFORMAT_DEFAULT;
  _simgui.desc.sample_count = 0;
  _simgui.is_osx = false;
  _simgui._113_7_ = 0;
  if (((desc->allocator).alloc == (_func_void_ptr_size_t_void_ptr *)0x0) ==
      ((desc->allocator).free == (_func_void_void_ptr_void_ptr *)0x0)) {
    _simgui.desc.max_vertices = 0x10000;
    if (desc->max_vertices != 0) {
      _simgui.desc.max_vertices = desc->max_vertices;
    }
    uVar2 = desc->color_format;
    uVar3 = desc->depth_format;
    uVar4 = *(undefined8 *)((long)&desc->ini_filename + 4);
    uVar5 = *(undefined8 *)((long)&(desc->allocator).alloc + 4);
    uVar6 = *(undefined8 *)((long)&(desc->allocator).free + 4);
    _simgui.desc.allocator.user_data._4_4_ = *(undefined4 *)((long)&(desc->allocator).user_data + 4)
    ;
    _simgui.desc.allocator.alloc._4_4_ = (undefined4)uVar5;
    _simgui.desc.allocator.free._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    _simgui.desc.allocator.free._4_4_ = (undefined4)uVar6;
    _simgui.desc.allocator.user_data._0_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    _simgui.desc.ini_filename._4_4_ = (undefined4)uVar4;
    _simgui.desc.no_default_font = SUB81((ulong)uVar4 >> 0x20,0);
    _simgui.desc.disable_paste_override = SUB81((ulong)uVar4 >> 0x28,0);
    _simgui.desc.disable_set_mouse_cursor = SUB81((ulong)uVar4 >> 0x30,0);
    _simgui.desc.disable_windows_resize_from_edges = SUB81((ulong)uVar4 >> 0x38,0);
    _simgui.desc._28_4_ = SUB84(*(undefined8 *)&desc->write_alpha_channel,0);
    _simgui.desc.allocator.alloc._0_4_ =
         (undefined4)((ulong)*(undefined8 *)&desc->write_alpha_channel >> 0x20);
    _simgui.desc.sample_count = (int)*(undefined8 *)&desc->sample_count;
    _simgui.desc.ini_filename._0_4_ =
         (undefined4)((ulong)*(undefined8 *)&desc->sample_count >> 0x20);
    _simgui.cur_dpi_scale = 1.0;
    _simgui.vbuf.id = 0;
    _simgui.is_osx = false;
    _simgui._113_7_ = 0;
    _simgui.desc.color_format = uVar2;
    _simgui.desc.depth_format = uVar3;
    if (0 < _simgui.desc.max_vertices) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (ulong)(uint)_simgui.desc.max_vertices * 0x14;
      _simgui.vertices = (sg_range)(auVar7 << 0x40);
      pvVar12 = _simgui_malloc((ulong)(uint)_simgui.desc.max_vertices * 0x14);
      _simgui.vertices.ptr = pvVar12;
      _simgui.indices.size = (long)_simgui.desc.max_vertices * 6;
      pvVar12 = _simgui_malloc((long)_simgui.desc.max_vertices * 6);
      _simgui.indices.ptr = pvVar12;
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      pIVar13 = ImGui::GetIO();
      if (_simgui.desc.no_default_font == false) {
        ImFontAtlas::AddFontDefault(pIVar13->Fonts,(ImFontConfig *)0x0);
      }
      pIVar13->IniFilename =
           (char *)CONCAT44(_simgui.desc.ini_filename._4_4_,_simgui.desc.ini_filename._0_4_);
      pIVar13->ConfigMacOSXBehaviors = false;
      uVar1 = pIVar13->BackendFlags;
      pIVar13->BackendFlags = uVar1 | 8;
      if (_simgui.desc.disable_set_mouse_cursor == false) {
        pIVar13->BackendFlags = uVar1 | 10;
      }
      pIVar13->SetClipboardTextFn = _simgui_set_clipboard;
      pIVar13->GetClipboardTextFn = _simgui_get_clipboard;
      pIVar13->ConfigWindowsResizeFromEdges =
           (bool)(_simgui.desc.disable_windows_resize_from_edges ^ 1);
      sg_push_debug_group("sokol-imgui");
      local_eb8.data.ptr = (void *)0x0;
      local_eb8._start_canary = 0;
      local_eb8._4_4_ = 0;
      local_eb8.data.size = 0;
      local_eb8.wgpu_buffer = (void *)0x0;
      local_eb8._end_canary = 0;
      local_eb8._92_4_ = 0;
      local_eb8.mtl_buffers[1] = (void *)0x0;
      local_eb8.d3d11_buffer = (void *)0x0;
      local_eb8.gl_buffers[0] = 0;
      local_eb8.gl_buffers[1] = 0;
      local_eb8.mtl_buffers[0] = (void *)0x0;
      local_eb8.type = _SG_BUFFERTYPE_DEFAULT;
      local_eb8.usage = SG_USAGE_STREAM;
      local_eb8.size = _simgui.vertices.size;
      local_eb8.label = "sokol-imgui-vertices";
      sVar8 = sg_make_buffer(&local_eb8);
      _simgui.vbuf.id = sVar8.id;
      local_f18.data.ptr = (void *)0x0;
      local_f18._start_canary = 0;
      local_f18._4_4_ = 0;
      local_f18.data.size = 0;
      local_f18.wgpu_buffer = (void *)0x0;
      local_f18._end_canary = 0;
      local_f18._92_4_ = 0;
      local_f18.mtl_buffers[1] = (void *)0x0;
      local_f18.d3d11_buffer = (void *)0x0;
      local_f18.gl_buffers[0] = 0;
      local_f18.gl_buffers[1] = 0;
      local_f18.mtl_buffers[0] = (void *)0x0;
      local_f18.type = SG_BUFFERTYPE_INDEXBUFFER;
      local_f18.usage = SG_USAGE_STREAM;
      local_f18.size = _simgui.indices.size;
      local_f18.label = "sokol-imgui-indices";
      sVar8 = sg_make_buffer(&local_f18);
      _simgui.ibuf.id = sVar8.id;
      if (_simgui.desc.no_default_font == false) {
        ImFontAtlas::GetTexDataAsRGBA32
                  (pIVar13->Fonts,(uchar **)&local_e50,&local_f1c,&local_f20,(int *)0x0);
        memset(&local_c18,0,0x698);
        local_c18.attrs[0].name = (char *)CONCAT44(local_f1c,local_c18.attrs[0].name._0_4_);
        local_c18.attrs[0].sem_name = (char *)CONCAT44(local_c18.attrs[0].sem_name._4_4_,local_f20);
        local_c18.attrs[1].name = (char *)CONCAT44(local_c18.attrs[1].name._4_4_,0x17);
        local_c18.attrs[1].sem_name = (char *)0x200000002;
        local_c18.attrs[1].sem_index = 2;
        local_c18.attrs[1]._20_4_ = 2;
        local_c18.attrs[3].sem_name = (char *)((long)(local_f20 * local_f1c) << 2);
        local_c18.vs.images[6].name = "sokol-imgui-font";
        sVar9 = sg_make_image((sg_image_desc *)&local_c18);
        _simgui.img.id = sVar9.id;
        pIVar13->Fonts->TexID = (ImTextureID)(ulong)sVar9.id;
      }
      memset(&local_c18,0,0xbe8);
      local_c18.attrs[0].name = "position";
      local_c18.attrs[1].name = "texcoord0";
      local_c18.attrs[2].name = "color0";
      local_c18.attrs[0].sem_name = "TEXCOORD";
      local_c18.attrs[1].sem_name = "TEXCOORD";
      local_c18.attrs[1].sem_index = 1;
      local_c18.attrs[2].sem_name = "TEXCOORD";
      local_c18.attrs[2].sem_index = 2;
      local_c18.vs.uniform_blocks[0].size = 0x10;
      local_c18.vs.uniform_blocks[0].uniforms[0].name = "vs_params";
      local_c18.vs.uniform_blocks[0].uniforms[0].type = SG_UNIFORMTYPE_FLOAT4;
      local_c18.vs.uniform_blocks[0].uniforms[0].array_count = 1;
      local_c18.fs.images[0].name = "tex";
      local_c18.fs.images[0].image_type = SG_IMAGETYPE_2D;
      local_c18.fs.images[0].sampler_type = SG_SAMPLERTYPE_FLOAT;
      local_c18.label = "sokol-imgui-shader";
      local_c18.vs.source =
           "#version 330\n\nuniform vec4 vs_params[1];\nlayout(location = 0) in vec2 position;\nout vec2 uv;\nlayout(location = 1) in vec2 texcoord0;\nout vec4 color;\nlayout(location = 2) in vec4 color0;\n\nvoid main()\n{\n    gl_Position = vec4(((position / vs_params[0].xy) - vec2(0.5)) * vec2(2.0, -2.0), 0.5, 1.0);\n    uv = texcoord0;\n    color = color0;\n}\n\n"
      ;
      local_c18.fs.source =
           "#version 330\n\nuniform sampler2D tex;\n\nlayout(location = 0) out vec4 frag_color;\nin vec2 uv;\nin vec4 color;\n\nvoid main()\n{\n    frag_color = texture(tex, uv) * color;\n}\n\n"
      ;
      sVar10 = sg_make_shader(&local_c18);
      _simgui.shd.id = sVar10.id;
      memset(&local_e50,0,0x238);
      local_e50.layout.buffers[0].stride = 0x14;
      local_e50.layout.attrs[0].format = SG_VERTEXFORMAT_FLOAT2;
      local_e50.layout.attrs[1].offset = 8;
      local_e50.layout.attrs[1].format = SG_VERTEXFORMAT_FLOAT2;
      local_e50.layout.attrs[2].offset = 0x10;
      local_e50.layout.attrs[2].format = SG_VERTEXFORMAT_UBYTE4N;
      local_e50.index_type = SG_INDEXTYPE_UINT16;
      local_e50.sample_count = _simgui.desc.sample_count;
      local_e50.depth.pixel_format = _simgui.desc.depth_format;
      local_e50.colors[0].pixel_format = _simgui.desc.color_format;
      local_e50.colors[0].write_mask = (_simgui.desc._28_4_ & 0xff) * 8 + SG_COLORMASK_RGB;
      local_e50.colors[0].blend.enabled = true;
      local_e50.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
      local_e50.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
      if ((_simgui.desc._28_4_ & 0xff) == 1) {
        local_e50.colors[0].blend.src_factor_alpha = SG_BLENDFACTOR_ONE;
        local_e50.colors[0].blend.dst_factor_alpha = SG_BLENDFACTOR_ONE;
      }
      local_e50.label = "sokol-imgui-pipeline";
      local_e50.shader = sVar10;
      sVar11 = sg_make_pipeline(&local_e50);
      _simgui.pip.id = sVar11.id;
      sg_pop_debug_group();
      return;
    }
    __assert_fail("_simgui.desc.max_vertices > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x6d7,"void simgui_setup(const simgui_desc_t *)");
  }
  __assert_fail("(desc->allocator.alloc && desc->allocator.free) || (!desc->allocator.alloc && !desc->allocator.free)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/util/sokol_imgui.h"
                ,0x6c4,"simgui_desc_t _simgui_desc_defaults(const simgui_desc_t *)");
}

Assistant:

SOKOL_API_IMPL void simgui_setup(const simgui_desc_t* desc) {
    SOKOL_ASSERT(desc);
    _simgui_clear(&_simgui, sizeof(_simgui));
    _simgui.desc = _simgui_desc_defaults(desc);
    _simgui.cur_dpi_scale = 1.0f;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
    _simgui.is_osx = _simgui_is_osx();
    #endif
    /* can keep color_format, depth_format and sample_count as is,
       since sokol_gfx.h will do its own default-value handling
    */

    /* allocate an intermediate vertex- and index-buffer */
    SOKOL_ASSERT(_simgui.desc.max_vertices > 0);
    _simgui.vertices.size = (size_t)_simgui.desc.max_vertices * sizeof(ImDrawVert);
    _simgui.vertices.ptr = _simgui_malloc(_simgui.vertices.size);
    _simgui.indices.size = (size_t)_simgui.desc.max_vertices * 3 * sizeof(ImDrawIdx);
    _simgui.indices.ptr = _simgui_malloc(_simgui.indices.size);

    /* initialize Dear ImGui */
    #if defined(__cplusplus)
        ImGui::CreateContext();
        ImGui::StyleColorsDark();
        ImGuiIO* io = &ImGui::GetIO();
        if (!_simgui.desc.no_default_font) {
            io->Fonts->AddFontDefault();
        }
    #else
        igCreateContext(NULL);
        igStyleColorsDark(igGetStyle());
        ImGuiIO* io = igGetIO();
        if (!_simgui.desc.no_default_font) {
            ImFontAtlas_AddFontDefault(io->Fonts, NULL);
        }
    #endif
    io->IniFilename = _simgui.desc.ini_filename;
    io->ConfigMacOSXBehaviors = _simgui_is_osx();
    io->BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        if (!_simgui.desc.disable_set_mouse_cursor) {
            io->BackendFlags |= ImGuiBackendFlags_HasMouseCursors;
        }
        io->SetClipboardTextFn = _simgui_set_clipboard;
        io->GetClipboardTextFn = _simgui_get_clipboard;
    #endif
    io->ConfigWindowsResizeFromEdges = !_simgui.desc.disable_windows_resize_from_edges;

    /* create sokol-gfx resources */
    sg_push_debug_group("sokol-imgui");

    /* NOTE: since we're in C++ mode here we can't use C99 designated init */
    sg_buffer_desc vb_desc;
    _simgui_clear(&vb_desc, sizeof(vb_desc));
    vb_desc.usage = SG_USAGE_STREAM;
    vb_desc.size = _simgui.vertices.size;
    vb_desc.label = "sokol-imgui-vertices";
    _simgui.vbuf = sg_make_buffer(&vb_desc);

    sg_buffer_desc ib_desc;
    _simgui_clear(&ib_desc, sizeof(ib_desc));
    ib_desc.type = SG_BUFFERTYPE_INDEXBUFFER;
    ib_desc.usage = SG_USAGE_STREAM;
    ib_desc.size = _simgui.indices.size;
    ib_desc.label = "sokol-imgui-indices";
    _simgui.ibuf = sg_make_buffer(&ib_desc);

    /* default font texture */
    if (!_simgui.desc.no_default_font) {
        unsigned char* font_pixels;
        int font_width, font_height;
        #if defined(__cplusplus)
            io->Fonts->GetTexDataAsRGBA32(&font_pixels, &font_width, &font_height);
        #else
            int bytes_per_pixel;
            ImFontAtlas_GetTexDataAsRGBA32(io->Fonts, &font_pixels, &font_width, &font_height, &bytes_per_pixel);
        #endif
        sg_image_desc img_desc;
        _simgui_clear(&img_desc, sizeof(img_desc));
        img_desc.width = font_width;
        img_desc.height = font_height;
        img_desc.pixel_format = SG_PIXELFORMAT_RGBA8;
        img_desc.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.min_filter = SG_FILTER_LINEAR;
        img_desc.mag_filter = SG_FILTER_LINEAR;
        img_desc.data.subimage[0][0].ptr = font_pixels;
        img_desc.data.subimage[0][0].size = (size_t)(font_width * font_height) * sizeof(uint32_t);
        img_desc.label = "sokol-imgui-font";
        _simgui.img = sg_make_image(&img_desc);
        io->Fonts->TexID = (ImTextureID)(uintptr_t) _simgui.img.id;
    }

    /* shader object for using the embedded shader source (or bytecode) */
    sg_shader_desc shd_desc;
    _simgui_clear(&shd_desc, sizeof(shd_desc));
    shd_desc.attrs[0].name = "position";
    shd_desc.attrs[1].name = "texcoord0";
    shd_desc.attrs[2].name = "color0";
    shd_desc.attrs[0].sem_name = "TEXCOORD";
    shd_desc.attrs[0].sem_index = 0;
    shd_desc.attrs[1].sem_name = "TEXCOORD";
    shd_desc.attrs[1].sem_index = 1;
    shd_desc.attrs[2].sem_name = "TEXCOORD";
    shd_desc.attrs[2].sem_index = 2;
    sg_shader_uniform_block_desc* ub = &shd_desc.vs.uniform_blocks[0];
    ub->size = sizeof(_simgui_vs_params_t);
    ub->uniforms[0].name = "vs_params";
    ub->uniforms[0].type = SG_UNIFORMTYPE_FLOAT4;
    ub->uniforms[0].array_count = 1;
    shd_desc.fs.images[0].name = "tex";
    shd_desc.fs.images[0].image_type = SG_IMAGETYPE_2D;
    shd_desc.fs.images[0].sampler_type = SG_SAMPLERTYPE_FLOAT;
    shd_desc.label = "sokol-imgui-shader";
    #if defined(SOKOL_GLCORE33)
        shd_desc.vs.source = _simgui_vs_source_glsl330;
        shd_desc.fs.source = _simgui_fs_source_glsl330;
    #elif defined(SOKOL_GLES2) || defined(SOKOL_GLES3)
        shd_desc.vs.source = _simgui_vs_source_glsl100;
        shd_desc.fs.source = _simgui_fs_source_glsl100;
    #elif defined(SOKOL_METAL)
        shd_desc.vs.entry = "main0";
        shd_desc.fs.entry = "main0";
        switch (sg_query_backend()) {
            case SG_BACKEND_METAL_MACOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_macos);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_macos);
                break;
            case SG_BACKEND_METAL_IOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_ios);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_ios);
                break;
            default:
                shd_desc.vs.source = _simgui_vs_source_metal_sim;
                shd_desc.fs.source = _simgui_fs_source_metal_sim;
                break;
        }
    #elif defined(SOKOL_D3D11)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_hlsl4);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_hlsl4);
    #elif defined(SOKOL_WGPU)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_wgpu);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_wgpu);
    #else
        shd_desc.vs.source = _simgui_vs_source_dummy;
        shd_desc.fs.source = _simgui_fs_source_dummy;
    #endif
    _simgui.shd = sg_make_shader(&shd_desc);

    /* pipeline object for imgui rendering */
    sg_pipeline_desc pip_desc;
    _simgui_clear(&pip_desc, sizeof(pip_desc));
    pip_desc.layout.buffers[0].stride = sizeof(ImDrawVert);
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[0];
        attr->offset = offsetof(ImDrawVert, pos);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[1];
        attr->offset = offsetof(ImDrawVert, uv);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[2];
        attr->offset = offsetof(ImDrawVert, col);
        attr->format = SG_VERTEXFORMAT_UBYTE4N;
    }
    pip_desc.shader = _simgui.shd;
    pip_desc.index_type = SG_INDEXTYPE_UINT16;
    pip_desc.sample_count = _simgui.desc.sample_count;
    pip_desc.depth.pixel_format = _simgui.desc.depth_format;
    pip_desc.colors[0].pixel_format = _simgui.desc.color_format;
    pip_desc.colors[0].write_mask = _simgui.desc.write_alpha_channel ? SG_COLORMASK_RGBA : SG_COLORMASK_RGB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
    pip_desc.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
    if (_simgui.desc.write_alpha_channel) {
        pip_desc.colors[0].blend.src_factor_alpha = SG_BLENDFACTOR_ONE;
        pip_desc.colors[0].blend.dst_factor_alpha = SG_BLENDFACTOR_ONE;
    }
    pip_desc.label = "sokol-imgui-pipeline";
    _simgui.pip = sg_make_pipeline(&pip_desc);

    sg_pop_debug_group();
}